

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_STAR(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam_00;
  loc_conflict finish;
  source origin;
  source sVar2;
  wchar_t flg;
  loc_conflict target;
  wchar_t i;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  if (player->timed[2] == 0) {
    msg("Light shoots in all directions!");
  }
  for (target.x = L'\0'; target.x < L'\b'; target.x = target.x + L'\x01') {
    finish = (loc_conflict)loc_sum(player->grid,ddgrid_ddd[target.x]);
    sVar2 = source_player();
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    origin.which.trap = sVar2.which.trap;
    _Var1 = project(origin,L'\0',finish,dam_00,context->subtype,L'V',L'\0','\0',context->obj);
    if (_Var1) {
      context->ident = true;
    }
  }
  return true;
}

Assistant:

bool effect_handler_STAR(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int i;
	struct loc target;

	int flg = PROJECT_THRU | PROJECT_BEAM | PROJECT_GRID | PROJECT_KILL;

	/* Describe */
	if (!player->timed[TMD_BLIND])
		msg("Light shoots in all directions!");

	for (i = 0; i < 8; i++) {
		/* Use the current direction */
		target = loc_sum(player->grid, ddgrid_ddd[i]);

		/* Aim at the target */
		if (project(source_player(), 0, target, dam, context->subtype, flg, 0,
					0, context->obj))
			context->ident = true;
	}

	return true;
}